

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces_tests.cpp
# Opt level: O3

void __thiscall interfaces_tests::findAncestorByHeight::test_method(findAncestorByHeight *this)

{
  uint256 *puVar1;
  Chain *pCVar2;
  uchar *puVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  int iVar12;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar13;
  Chainstate *pCVar14;
  char *pcVar15;
  iterator pvVar16;
  iterator in_R9;
  iterator pvVar17;
  long in_FS_OFFSET;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  check_type cVar20;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  lazy_ostream local_170;
  undefined1 *local_160;
  assertion_result *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  assertion_result *local_130;
  uint256 *local_128;
  char *local_120;
  char *local_118;
  assertion_result local_110;
  uint256 *local_f8;
  undefined1 uStack_f0;
  undefined7 uStack_ef;
  undefined1 *puStack_e8;
  uint256 **local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  assertion_result local_98;
  uchar uStack_80;
  uchar uStack_7f;
  uchar uStack_7e;
  uchar uStack_7d;
  uchar uStack_7c;
  uchar uStack_7b;
  uchar uStack_7a;
  uchar uStack_79;
  uint256 hash;
  undefined **local_58;
  ulong uStack_50;
  undefined1 *local_48;
  assertion_result **ppaStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar13 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.chainman;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (puVar13,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
             ,0x4e,"test_method","m_node.chainman");
  criticalblock15.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock15.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock15.super_unique_lock);
  pcVar15 = "m_node.chainman";
  puVar13 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                      (puVar13,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
                       ,0x50,"test_method","m_node.chainman");
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((puVar13->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x52;
  file.m_begin = (iterator)&local_140;
  msg.m_end = in_R9;
  msg.m_begin = pcVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_150,msg);
  puVar1 = (pCVar14->m_chain).vChain.
           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
           super__Vector_impl_data._M_start[0x14]->phashBlock;
  if (puVar1 != (uint256 *)0x0) {
    pCVar2 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.chain._M_t.
             super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
             super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
             super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
    local_58 = *(undefined ***)&puVar1->super_base_blob<256U>;
    uStack_50 = *(ulong *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
    local_48 = *(undefined1 **)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
    ppaStack_40 = *(assertion_result ***)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
    local_c0 = 0;
    uStack_bf = 0;
    uStack_b8 = 0;
    local_d0 = 0;
    uStack_c8 = 0;
    local_e0 = (uint256 **)0x0;
    uStack_d8 = 0;
    uStack_f0 = 0;
    uStack_ef = 0;
    puStack_e8 = (undefined1 *)0x0;
    local_b0 = 0;
    uStack_af = 0;
    local_f8 = &hash;
    _cVar20 = 0x400dca;
    iVar12 = (*pCVar2->_vptr_Chain[0xc])(pCVar2,&local_58,10,&local_f8);
    local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         SUB41(iVar12,0);
    local_98.m_message.px = (element_type *)0x0;
    local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_158 = &local_110;
    local_110._0_8_ =
         "chain->findAncestorByHeight(active[20]->GetBlockHash(), 10, FoundBlock().hash(hash))";
    local_110.m_message.px = (element_type *)0xe76875;
    local_170.m_empty = false;
    local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
    local_160 = boost::unit_test::lazy_ostream::inst;
    local_180 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
    ;
    local_178 = "";
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_98,&local_170,1,0,WARN,_cVar20,(size_t)&local_180,0x52);
    boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
    local_190 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
    ;
    local_188 = "";
    local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_198 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x53;
    file_00.m_begin = (iterator)&local_190;
    msg_00.m_end = pvVar17;
    msg_00.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a0,
               msg_00);
    local_170.m_empty = false;
    local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
    local_160 = boost::unit_test::lazy_ostream::inst;
    local_158 = (assertion_result *)0xf4aea1;
    puVar1 = (pCVar14->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start[10]->phashBlock;
    if (puVar1 != (uint256 *)0x0) {
      local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           *(readonly_property<bool> *)&puVar1->super_base_blob<256U>;
      local_98._1_1_ = (puVar1->super_base_blob<256U>).m_data._M_elems[1];
      local_98._2_1_ = (puVar1->super_base_blob<256U>).m_data._M_elems[2];
      local_98._3_1_ = (puVar1->super_base_blob<256U>).m_data._M_elems[3];
      local_98._4_1_ = (puVar1->super_base_blob<256U>).m_data._M_elems[4];
      local_98._5_1_ = (puVar1->super_base_blob<256U>).m_data._M_elems[5];
      local_98._6_1_ = (puVar1->super_base_blob<256U>).m_data._M_elems[6];
      local_98._7_1_ = (puVar1->super_base_blob<256U>).m_data._M_elems[7];
      puVar3 = (puVar1->super_base_blob<256U>).m_data._M_elems + 8;
      uVar4 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x10];
      uVar5 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x11];
      uVar6 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x12];
      uVar7 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x13];
      uVar8 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x14];
      uVar9 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x15];
      uVar10 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x16];
      uVar11 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x17];
      uStack_80 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x18];
      uStack_7f = (puVar1->super_base_blob<256U>).m_data._M_elems[0x19];
      uStack_7e = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1a];
      uStack_7d = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1b];
      uStack_7c = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1c];
      uStack_7b = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1d];
      uStack_7a = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1e];
      uStack_79 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1f];
      local_98.m_message.pn.pi_._0_1_ = uVar4;
      local_98.m_message.pn.pi_._1_1_ = uVar5;
      local_98.m_message.pn.pi_._2_1_ = uVar6;
      local_98.m_message.pn.pi_._3_1_ = uVar7;
      local_98.m_message.pn.pi_._4_1_ = uVar8;
      local_98.m_message.pn.pi_._5_1_ = uVar9;
      local_98.m_message.pn.pi_._6_1_ = uVar10;
      local_98.m_message.pn.pi_._7_1_ = uVar11;
      local_98.m_message.px = *(element_type **)puVar3;
      auVar19[0] = -(uVar4 == hash.super_base_blob<256U>.m_data._M_elems[0x10]);
      auVar19[1] = -(uVar5 == hash.super_base_blob<256U>.m_data._M_elems[0x11]);
      auVar19[2] = -(uVar6 == hash.super_base_blob<256U>.m_data._M_elems[0x12]);
      auVar19[3] = -(uVar7 == hash.super_base_blob<256U>.m_data._M_elems[0x13]);
      auVar19[4] = -(uVar8 == hash.super_base_blob<256U>.m_data._M_elems[0x14]);
      auVar19[5] = -(uVar9 == hash.super_base_blob<256U>.m_data._M_elems[0x15]);
      auVar19[6] = -(uVar10 == hash.super_base_blob<256U>.m_data._M_elems[0x16]);
      auVar19[7] = -(uVar11 == hash.super_base_blob<256U>.m_data._M_elems[0x17]);
      auVar19[8] = -(uStack_80 == hash.super_base_blob<256U>.m_data._M_elems[0x18]);
      auVar19[9] = -(uStack_7f == hash.super_base_blob<256U>.m_data._M_elems[0x19]);
      auVar19[10] = -(uStack_7e == hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
      auVar19[0xb] = -(uStack_7d == hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
      auVar19[0xc] = -(uStack_7c == hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
      auVar19[0xd] = -(uStack_7b == hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
      auVar19[0xe] = -(uStack_7a == hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
      auVar19[0xf] = -(uStack_79 == hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
      auVar18[0] = -(local_98.p_predicate_value.super_readonly_property<bool>.
                     super_class_property<bool>.value ==
                    (readonly_property<bool>)hash.super_base_blob<256U>.m_data._M_elems[0]);
      auVar18[1] = -(local_98._1_1_ == hash.super_base_blob<256U>.m_data._M_elems[1]);
      auVar18[2] = -(local_98._2_1_ == hash.super_base_blob<256U>.m_data._M_elems[2]);
      auVar18[3] = -(local_98._3_1_ == hash.super_base_blob<256U>.m_data._M_elems[3]);
      auVar18[4] = -(local_98._4_1_ == hash.super_base_blob<256U>.m_data._M_elems[4]);
      auVar18[5] = -(local_98._5_1_ == hash.super_base_blob<256U>.m_data._M_elems[5]);
      auVar18[6] = -(local_98._6_1_ == hash.super_base_blob<256U>.m_data._M_elems[6]);
      auVar18[7] = -(local_98._7_1_ == hash.super_base_blob<256U>.m_data._M_elems[7]);
      auVar18[8] = -(*puVar3 == hash.super_base_blob<256U>.m_data._M_elems[8]);
      auVar18[9] = -((puVar1->super_base_blob<256U>).m_data._M_elems[9] ==
                    hash.super_base_blob<256U>.m_data._M_elems[9]);
      auVar18[10] = -((puVar1->super_base_blob<256U>).m_data._M_elems[10] ==
                     hash.super_base_blob<256U>.m_data._M_elems[10]);
      auVar18[0xb] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      hash.super_base_blob<256U>.m_data._M_elems[0xb]);
      auVar18[0xc] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      hash.super_base_blob<256U>.m_data._M_elems[0xc]);
      auVar18[0xd] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      hash.super_base_blob<256U>.m_data._M_elems[0xd]);
      auVar18[0xe] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      hash.super_base_blob<256U>.m_data._M_elems[0xe]);
      auVar18[0xf] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      hash.super_base_blob<256U>.m_data._M_elems[0xf]);
      auVar18 = auVar18 & auVar19;
      local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           (readonly_property<bool>)
           ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff);
      local_110.m_message.px = (element_type *)0x0;
      local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_120 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
      ;
      local_118 = "";
      local_e0 = &local_128;
      local_128 = &hash;
      uStack_f0 = 0;
      local_f8 = (uint256 *)&PTR__lazy_ostream_01389a00;
      puStack_e8 = boost::unit_test::lazy_ostream::inst;
      ppaStack_40 = &local_130;
      uStack_50 = uStack_50 & 0xffffffffffffff00;
      local_58 = &PTR__lazy_ostream_01389a00;
      local_48 = boost::unit_test::lazy_ostream::inst;
      pvVar16 = (iterator)0x1;
      pvVar17 = (iterator)0x2;
      local_130 = &local_98;
      boost::test_tools::tt_detail::report_assertion
                (&local_110,&local_170,1,2,REQUIRE,0xf9b873,(size_t)&local_120,0x53,&local_f8,
                 "active[10]->GetBlockHash()",&local_58);
      boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
      local_1b0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
      ;
      local_1a8 = "";
      local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x54;
      file_01.m_begin = (iterator)&local_1b0;
      msg_01.m_end = pvVar17;
      msg_01.m_begin = pvVar16;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1c0,
                 msg_01);
      puVar1 = (pCVar14->m_chain).vChain.
               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
               super__Vector_impl_data._M_start[10]->phashBlock;
      if (puVar1 != (uint256 *)0x0) {
        pCVar2 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                 super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain._M_t.
                 super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                 .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
        local_58 = *(undefined ***)&puVar1->super_base_blob<256U>;
        uStack_50 = *(ulong *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
        local_48 = *(undefined1 **)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
        ppaStack_40 = *(assertion_result ***)
                       ((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
        uStack_b8 = 0;
        local_b0 = 0;
        uStack_c8 = 0;
        local_c0 = 0;
        uStack_bf = 0;
        uStack_d8 = 0;
        local_d0 = 0;
        puStack_e8 = (undefined1 *)0x0;
        local_e0 = (uint256 **)0x0;
        local_f8 = (uint256 *)0x0;
        uStack_f0 = 0;
        uStack_ef = 0;
        _cVar20 = 0x40108e;
        iVar12 = (*pCVar2->_vptr_Chain[0xc])(pCVar2,&local_58,0x14);
        local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)((byte)iVar12 ^ 1);
        local_98.m_message.px = (element_type *)0x0;
        local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_110._0_8_ = "!chain->findAncestorByHeight(active[10]->GetBlockHash(), 20)";
        local_110.m_message.px = (element_type *)0xe768b2;
        local_170.m_empty = false;
        local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
        local_160 = boost::unit_test::lazy_ostream::inst;
        local_1d0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
        ;
        local_1c8 = "";
        local_158 = &local_110;
        boost::test_tools::tt_detail::report_assertion
                  (&local_98,&local_170,1,0,WARN,_cVar20,(size_t)&local_1d0,0x54);
        boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock15.super_unique_lock);
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return;
      }
    }
  }
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

BOOST_AUTO_TEST_CASE(findAncestorByHeight)
{
    LOCK(Assert(m_node.chainman)->GetMutex());
    auto& chain = m_node.chain;
    const CChain& active = Assert(m_node.chainman)->ActiveChain();
    uint256 hash;
    BOOST_CHECK(chain->findAncestorByHeight(active[20]->GetBlockHash(), 10, FoundBlock().hash(hash)));
    BOOST_CHECK_EQUAL(hash, active[10]->GetBlockHash());
    BOOST_CHECK(!chain->findAncestorByHeight(active[10]->GetBlockHash(), 20));
}